

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void set_time_915(uchar *p,time_t t)

{
  tm tm;
  time_t local_50;
  tm local_48;
  
  local_50 = t;
  get_tmfromtime(&local_48,&local_50);
  *p = (uchar)local_48.tm_year;
  p[1] = (char)local_48.tm_mon + '\x01';
  p[2] = (uchar)local_48.tm_mday;
  p[3] = (uchar)local_48.tm_hour;
  p[4] = (uchar)local_48.tm_min;
  p[5] = (uchar)local_48.tm_sec;
  p[6] = (uchar)(local_48.tm_gmtoff / 900);
  return;
}

Assistant:

static void
set_time_915(unsigned char *p, time_t t)
{
	struct tm tm;

	get_tmfromtime(&tm, &t);
	set_num_711(p+0, tm.tm_year);
	set_num_711(p+1, tm.tm_mon+1);
	set_num_711(p+2, tm.tm_mday);
	set_num_711(p+3, tm.tm_hour);
	set_num_711(p+4, tm.tm_min);
	set_num_711(p+5, tm.tm_sec);
	set_num_712(p+6, (char)(get_gmoffset(&tm)/(60*15)));
}